

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UnconditionalBranchDirectiveSyntax::setChild
          (UnconditionalBranchDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 0) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->super_DirectiveSyntax).directive.kind = TVar4.kind;
    (this->super_DirectiveSyntax).directive.field_0x2 = TVar4._2_1_;
    (this->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->super_DirectiveSyntax).directive.rawLen = TVar4.rawLen;
    (this->super_DirectiveSyntax).directive.info = TVar4.info;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->disabledTokens).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void UnconditionalBranchDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: disabledTokens = child.node()->as<TokenList>(); return;
        default: SLANG_UNREACHABLE;
    }
}